

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  secp256k1_scalar sVar1;
  
  secp256k1_scalar_verify(a);
  sVar1 = 0xd - *a;
  if (*a == 0) {
    sVar1 = 0;
  }
  *r = sVar1;
  secp256k1_scalar_verify(r);
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    SECP256K1_SCALAR_VERIFY(a);

    if (*a == 0) {
        *r = 0;
    } else {
        *r = EXHAUSTIVE_TEST_ORDER - *a;
    }

    SECP256K1_SCALAR_VERIFY(r);
}